

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arena.h
# Opt level: O2

BiasLayerParams *
google::protobuf::Arena::CreateMessageInternal<CoreML::Specification::BiasLayerParams>(Arena *arena)

{
  BiasLayerParams *pBVar1;
  
  if (arena != (Arena *)0x0) {
    pBVar1 = DoCreateMessage<CoreML::Specification::BiasLayerParams>(arena);
    return pBVar1;
  }
  pBVar1 = (BiasLayerParams *)operator_new(0x38);
  CoreML::Specification::BiasLayerParams::BiasLayerParams(pBVar1,(Arena *)0x0,false);
  return pBVar1;
}

Assistant:

PROTOBUF_NDEBUG_INLINE static T* CreateMessageInternal(Arena* arena) {
    static_assert(
        InternalHelper<T>::is_arena_constructable::value,
        "CreateMessage can only construct types that are ArenaConstructable");
    if (arena == NULL) {
      // Generated arena constructor T(Arena*) is protected. Call via
      // InternalHelper.
      return InternalHelper<T>::New();
    } else {
      return arena->DoCreateMessage<T>();
    }
  }